

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

void __thiscall zmq::pipe_t::process_delimiter(pipe_t *this)

{
  anon_enum_32 aVar1;
  
  aVar1 = this->_state;
  if ((aVar1 & ~waiting_for_delimiter) != active) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "_state == active || _state == waiting_for_delimiter",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pipe.cpp"
            ,0x1f8);
    fflush(_stderr);
    zmq_abort("_state == active || _state == waiting_for_delimiter");
    aVar1 = this->_state;
  }
  if (aVar1 == active) {
    aVar1 = delimiter_received;
  }
  else {
    rollback(this);
    this->_out_pipe = (upipe_t *)0x0;
    object_t::send_pipe_term_ack(&this->super_object_t,this->_peer);
    aVar1 = term_ack_sent;
  }
  this->_state = aVar1;
  return;
}

Assistant:

void zmq::pipe_t::process_delimiter ()
{
    zmq_assert (_state == active || _state == waiting_for_delimiter);

    if (_state == active)
        _state = delimiter_received;
    else {
        rollback ();
        _out_pipe = NULL;
        send_pipe_term_ack (_peer);
        _state = term_ack_sent;
    }
}